

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O1

void __thiscall DFsVariable::Serialize(DFsVariable *this,FSerializer *ar)

{
  FSerializer *pFVar1;
  
  DObject::Serialize(&this->super_DObject,ar);
  pFVar1 = ::Serialize(ar,"name",&this->Name,(FString *)0x0);
  pFVar1 = ::Serialize(pFVar1,"type",&this->type,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"string",&this->string,(FString *)0x0);
  ::Serialize(pFVar1,"actor",(DObject **)&this->actor,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"value",&(this->value).i,(int32_t *)0x0);
  ::Serialize(pFVar1,"next",(DObject **)&this->next,(DObject **)0x0,(bool *)0x0);
  return;
}

Assistant:

void DFsVariable::Serialize(FSerializer & ar)
{
	Super::Serialize(ar);
	ar("name", Name)
		("type", type)
		("string", string)
		("actor", actor)
		("value", value.i)
		("next", next);
}